

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molly-test.cc
# Opt level: O2

int main(void)

{
  DeviceState DVar1;
  ostream *poVar2;
  int __oflag;
  char *pcVar3;
  DeviceState lastState;
  Device device;
  DeviceState local_58;
  Device local_54;
  string local_50 [32];
  
  molly::Device::Device(&local_54);
  std::__cxx11::string::string(local_50,"/dev/big_red_button",(allocator *)&local_58);
  molly::Device::open(&local_54,(char *)local_50,__oflag);
  std::__cxx11::string::~string(local_50);
  local_58 = Unknown;
LAB_001023ab:
  DVar1 = molly::Device::sample(&local_54);
  if (DVar1 != LidClosed) {
    if (DVar1 != ButtonPressed) goto code_r0x001023bf;
    pcVar3 = "PRESS!!!";
    if (local_58 == ButtonPressed) goto LAB_0010240b;
    goto LAB_001023dd;
  }
  if (local_58 != LidClosed) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Closed from ");
    poVar2 = molly::operator<<(poVar2,&local_58);
    goto LAB_00102403;
  }
  goto LAB_0010240b;
code_r0x001023bf:
  if (DVar1 == LidOpen) {
    pcVar3 = "OPEN...";
    if ((uint)(local_58 + ~LidOpen) < 0xfffffffe) {
LAB_001023dd:
      poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
LAB_00102403:
      std::endl<char,std::char_traits<char>>(poVar2);
    }
LAB_0010240b:
    local_58 = DVar1;
    usleep(20000);
  }
  goto LAB_001023ab;
}

Assistant:

int main()
{
  Device device;
  device.open("/dev/big_red_button");

  DeviceState lastState = DeviceState::Unknown;

#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-noreturn"
  while (true)
  {
    DeviceState state = device.sample();

    switch (state)
    {
      case DeviceState::ButtonPressed:
        if (lastState != DeviceState::ButtonPressed)
          cout << "PRESS!!!" << endl;
        break;
      case DeviceState::LidOpen:
        if (lastState != DeviceState::LidOpen && lastState != DeviceState::ButtonPressed)
          cout << "OPEN..." << endl;
        break;
      case DeviceState::LidClosed:
        if (lastState != DeviceState::LidClosed)
          cout << "Closed from " << lastState << endl;
        break;
      default:
        continue;
    }

    lastState = state;

    usleep(20000);
  }
#pragma clang diagnostic pop
}